

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O1

void __thiscall
FOptionMenuSliderBase::DrawSlider
          (FOptionMenuSliderBase *this,int x,int y,double min,double max,double cur,int fracdigits,
          int indent)

{
  int iVar1;
  int iVar2;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000084;
  int x_00;
  int iVar3;
  double dVar4;
  char textbuf [16];
  
  x_00 = CleanXfac_1 * 100 + x;
  iVar3 = (OptionSettings.mLinespacing + -8) * CleanYfac_1;
  dVar4 = max;
  if (cur <= max) {
    dVar4 = cur;
  }
  if (fracdigits < 0) {
    iVar2 = 0;
  }
  else {
    mysnprintf(textbuf,0x10,"%.*f",SUB84(max,0),CONCAT44(in_register_0000000c,fracdigits),
               CONCAT44(in_register_00000084,indent));
    iVar2 = FFont::StringWidth(SmallFont,(BYTE *)textbuf);
    iVar2 = iVar2 * CleanXfac_1;
  }
  iVar3 = iVar3 + y;
  dVar4 = (double)(~-(ulong)(min < cur) & (ulong)min | (ulong)dVar4 & -(ulong)(min < cur)) - min;
  iVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
  this->mSliderShort = (uint)(iVar1 < x_00 + iVar2);
  if (iVar1 < x_00 + iVar2) {
    M_DrawConText(9,x,iVar3,"\x10\x11\x11\x11\x11\x11\x12");
    M_DrawConText(8,(int)((double)CleanXfac_1 * ((dVar4 * 38.0) / (max - min) + 5.0)) + x,iVar3,
                  "\x13");
    x_00 = x_00 + CleanXfac_1 * -0x28;
  }
  else {
    M_DrawConText(9,x,iVar3,"\x10\x11\x11\x11\x11\x11\x11\x11\x11\x11\x11\x12");
    M_DrawConText(8,(int)((double)CleanXfac_1 * ((dVar4 * 78.0) / (max - min) + 5.0)) + x,iVar3,
                  "\x13");
  }
  if ((-1 < fracdigits) && (iVar2 + x_00 <= (screen->super_DSimpleCanvas).super_DCanvas.Width)) {
    mysnprintf(textbuf,0x10,"%.*f",SUB84(cur,0));
    DCanvas::DrawText((DCanvas *)screen,SmallFont,0x14,x_00,y,textbuf,0x40001394,1,0);
  }
  return;
}

Assistant:

void DrawSlider (int x, int y, double min, double max, double cur, int fracdigits, int indent)
	{
		char textbuf[16];
		double range;
		int maxlen = 0;
		int right = x + (12*8 + 4) * CleanXfac_1;
		int cy = y + (OptionSettings.mLinespacing-8)*CleanYfac_1;

		range = max - min;
		double ccur = clamp(cur, min, max) - min;

		if (fracdigits >= 0)
		{
			mysnprintf(textbuf, countof(textbuf), "%.*f", fracdigits, max);
			maxlen = SmallFont->StringWidth(textbuf) * CleanXfac_1;
		}

		mSliderShort = right + maxlen > screen->GetWidth();

		if (!mSliderShort)
		{
			M_DrawConText(CR_WHITE, x, cy, "\x10\x11\x11\x11\x11\x11\x11\x11\x11\x11\x11\x12");
			M_DrawConText(CR_ORANGE, x + int((5 + ((ccur * 78) / range)) * CleanXfac_1), cy, "\x13");
		}
		else
		{
			// On 320x200 we need a shorter slider
			M_DrawConText(CR_WHITE, x, cy, "\x10\x11\x11\x11\x11\x11\x12");
			M_DrawConText(CR_ORANGE, x + int((5 + ((ccur * 38) / range)) * CleanXfac_1), cy, "\x13");
			right -= 5*8*CleanXfac_1;
		}

		if (fracdigits >= 0 && right + maxlen <= screen->GetWidth())
		{
			mysnprintf(textbuf, countof(textbuf), "%.*f", fracdigits, cur);
			screen->DrawText(SmallFont, CR_DARKGRAY, right, y, textbuf, DTA_CleanNoMove_1, true, TAG_DONE);
		}
	}